

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O3

void __thiscall rw::PluginList::streamSkip(PluginList *this,Stream *stream)

{
  bool bVar1;
  int32 length;
  ChunkHeaderInfo header;
  uint32 local_24;
  ChunkHeaderInfo local_20;
  
  bVar1 = findChunk(stream,3,&local_24,(uint32 *)0x0);
  if ((bVar1) && (0 < (int)local_24)) {
    do {
      bVar1 = readChunkHeaderInfo(stream,&local_20);
      if (!bVar1) {
        return;
      }
      (*stream->_vptr_Stream[5])(stream,(ulong)local_20.length,1);
      local_24 = (local_24 - local_20.length) - 0xc;
    } while (0 < (int)local_24);
  }
  return;
}

Assistant:

void
PluginList::streamSkip(Stream *stream)
{
	int32 length;
	ChunkHeaderInfo header;
	if(!findChunk(stream, ID_EXTENSION, (uint32*)&length, nil))
		return;
	while(length > 0){
		if(!readChunkHeaderInfo(stream, &header))
			return;
		stream->seek(header.length);
		length -= 12 + header.length;
	}
}